

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.h
# Opt level: O0

void __thiscall
HighsLinearSumBounds::setBoundArrays
          (HighsLinearSumBounds *this,double *varLower,double *varUpper,double *implVarLower,
          double *implVarUpper,HighsInt *implVarLowerSource,HighsInt *implVarUpperSource)

{
  HighsInt *implVarLowerSource_local;
  double *implVarUpper_local;
  double *implVarLower_local;
  double *varUpper_local;
  double *varLower_local;
  HighsLinearSumBounds *this_local;
  
  this->varLower = varLower;
  this->varUpper = varUpper;
  this->implVarLower = implVarLower;
  this->implVarUpper = implVarUpper;
  this->implVarLowerSource = implVarLowerSource;
  this->implVarUpperSource = implVarUpperSource;
  return;
}

Assistant:

void setBoundArrays(const double* varLower, const double* varUpper,
                      const double* implVarLower, const double* implVarUpper,
                      const HighsInt* implVarLowerSource,
                      const HighsInt* implVarUpperSource) {
    this->varLower = varLower;
    this->varUpper = varUpper;
    this->implVarLower = implVarLower;
    this->implVarUpper = implVarUpper;
    this->implVarLowerSource = implVarLowerSource;
    this->implVarUpperSource = implVarUpperSource;
  }